

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O0

int TBoardToInt(TBoard *board)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  const_reference pvVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  std::array<std::array<int,_3UL>,_3UL>::operator[]
            ((array<std::array<int,_3UL>,_3UL> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  pvVar9 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar4 = *pvVar9 * (int)g_factors[0];
  std::array<std::array<int,_3UL>,_3UL>::operator[]
            ((array<std::array<int,_3UL>,_3UL> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,iVar4));
  pvVar9 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      CONCAT44(in_stack_ffffffffffffffdc,iVar4));
  iVar5 = iVar4 + *pvVar9 * (int)g_factors[1];
  std::array<std::array<int,_3UL>,_3UL>::operator[]
            ((array<std::array<int,_3UL>,_3UL> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),CONCAT44(iVar5,iVar4));
  pvVar9 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      CONCAT44(iVar5,iVar4));
  iVar6 = iVar5 + *pvVar9 * (int)g_factors[2];
  std::array<std::array<int,_3UL>,_3UL>::operator[]
            ((array<std::array<int,_3UL>,_3UL> *)CONCAT44(in_stack_ffffffffffffffe4,iVar6),
             CONCAT44(iVar5,iVar4));
  pvVar9 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)CONCAT44(in_stack_ffffffffffffffe4,iVar6),
                      CONCAT44(iVar5,iVar4));
  iVar7 = iVar6 + *pvVar9 * (int)g_factors[3];
  std::array<std::array<int,_3UL>,_3UL>::operator[]
            ((array<std::array<int,_3UL>,_3UL> *)CONCAT44(iVar7,iVar6),CONCAT44(iVar5,iVar4));
  pvVar9 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)CONCAT44(iVar7,iVar6),CONCAT44(iVar5,iVar4));
  iVar8 = iVar7 + *pvVar9 * (int)g_factors[4];
  std::array<std::array<int,_3UL>,_3UL>::operator[]
            ((array<std::array<int,_3UL>,_3UL> *)CONCAT44(iVar7,iVar6),CONCAT44(iVar5,iVar4));
  pvVar9 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)CONCAT44(iVar7,iVar6),CONCAT44(iVar5,iVar4));
  iVar1 = *pvVar9;
  iVar10 = (int)g_factors[5];
  std::array<std::array<int,_3UL>,_3UL>::operator[]
            ((array<std::array<int,_3UL>,_3UL> *)CONCAT44(iVar7,iVar6),CONCAT44(iVar5,iVar4));
  pvVar9 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)CONCAT44(iVar7,iVar6),CONCAT44(iVar5,iVar4));
  iVar2 = *pvVar9;
  iVar11 = (int)g_factors[6];
  std::array<std::array<int,_3UL>,_3UL>::operator[]
            ((array<std::array<int,_3UL>,_3UL> *)CONCAT44(iVar7,iVar6),CONCAT44(iVar5,iVar4));
  pvVar9 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)CONCAT44(iVar7,iVar6),CONCAT44(iVar5,iVar4));
  iVar3 = *pvVar9;
  iVar12 = (int)g_factors[7];
  std::array<std::array<int,_3UL>,_3UL>::operator[]
            ((array<std::array<int,_3UL>,_3UL> *)CONCAT44(iVar7,iVar6),CONCAT44(iVar5,iVar4));
  pvVar9 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)CONCAT44(iVar7,iVar6),CONCAT44(iVar5,iVar4));
  return iVar8 + iVar1 * iVar10 + iVar2 * iVar11 + iVar3 * iVar12 + *pvVar9 * (int)g_factors[8];
}

Assistant:

static int
TBoardToInt(const TBoard &board)
{
    return board[0][0] * g_factors[0] + board[0][1] * g_factors[1] + board[0][2] * g_factors[2] +
           board[1][0] * g_factors[3] + board[1][1] * g_factors[4] + board[1][2] * g_factors[5] +
           board[2][0] * g_factors[6] + board[2][1] * g_factors[7] + board[2][2] * g_factors[8];
}